

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

int trytop(rnndb *db,char *file,xmlNode *node)

{
  xmlChar *pxVar1;
  xmlAttr *pxVar2;
  rnndb *prVar3;
  xmlNode *attr;
  int iVar4;
  int iVar5;
  int iVar6;
  uint64_t uVar7;
  rnnenum *prVar8;
  rnnenum **__ptr;
  rnnbitset *prVar9;
  rnnbitset **__ptr_00;
  char *pcVar10;
  rnngroup *prVar11;
  rnngroup **__ptr_01;
  rnnspectype *prVar12;
  rnnspectype **__ptr_02;
  rnnvalue *prVar13;
  rnnvalue **__ptr_03;
  rnndomain *prVar14;
  rnndomain **__ptr_04;
  rnnbitfield *prVar15;
  rnnbitfield **__ptr_05;
  rnnauthor *prVar16;
  char *pcVar17;
  char **__ptr_06;
  rnnauthor **__ptr_07;
  rnndelem *prVar18;
  rnndelem **pprVar19;
  xmlNode *node_00;
  xmlNode *node_01;
  xmlNode *node_02;
  xmlNode *node_03;
  xmlNode *node_04;
  ulong uVar20;
  _xmlAttr **pp_Var21;
  ulong uVar22;
  _xmlNode *p_Var23;
  _xmlAttr *attr_00;
  uint uVar24;
  _xmlNode **pp_Var25;
  char *local_60;
  char *local_50;
  char *local_48;
  char *local_40;
  
  pxVar1 = node->name;
  iVar4 = strcmp((char *)pxVar1,"enum");
  if (iVar4 == 0) {
    pcVar17 = (char *)0x0;
    iVar4 = 0;
    iVar6 = 0;
    local_60 = (char *)0x0;
    local_50 = (char *)0x0;
    local_48 = (char *)0x0;
    pp_Var21 = &node->properties;
    while (pxVar2 = *pp_Var21, pxVar2 != (xmlAttr *)0x0) {
      pxVar1 = pxVar2->name;
      iVar5 = strcmp((char *)pxVar1,"name");
      if (iVar5 == 0) {
        pcVar17 = getattrib(db,file,(uint)node->line,pxVar2);
      }
      else {
        iVar5 = strcmp((char *)pxVar1,"bare");
        if (iVar5 == 0) {
          iVar6 = getboolattrib(db,file,(uint)node->line,pxVar2);
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"inline");
          if (iVar5 == 0) {
            iVar4 = getboolattrib(db,file,(uint)node->line,pxVar2);
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"prefix");
            if (iVar5 == 0) {
              pcVar10 = getattrib(db,file,(uint)node->line,pxVar2);
              local_60 = strdup(pcVar10);
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"varset");
              if (iVar5 == 0) {
                pcVar10 = getattrib(db,file,(uint)node->line,pxVar2);
                local_50 = strdup(pcVar10);
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"variants");
                if (iVar5 == 0) {
                  pcVar10 = getattrib(db,file,(uint)node->line,pxVar2);
                  local_48 = strdup(pcVar10);
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for enum\n",file,(ulong)node->line,
                          pxVar1);
                  db->estatus = 1;
                }
              }
            }
          }
        }
      }
      pp_Var21 = &pxVar2->next;
    }
    if (pcVar17 != (char *)0x0) {
      uVar24 = db->enumsnum;
      uVar22 = 0;
      uVar20 = 0;
      if (0 < (int)uVar24) {
        uVar20 = (ulong)uVar24;
      }
      do {
        if (uVar20 == uVar22) {
          prVar8 = (rnnenum *)calloc(0x78,1);
          pcVar17 = strdup(pcVar17);
          prVar8->name = pcVar17;
          prVar8->isinline = iVar4;
          prVar8->bare = iVar6;
          (prVar8->varinfo).prefixstr = local_60;
          (prVar8->varinfo).varsetstr = local_50;
          (prVar8->varinfo).variantsstr = local_48;
          prVar8->file = file;
          iVar4 = db->enumsmax;
          __ptr = db->enums;
          if (iVar4 <= (int)uVar24) {
            iVar6 = iVar4 * 2;
            if (iVar4 == 0) {
              iVar6 = 0x10;
            }
            db->enumsmax = iVar6;
            __ptr = (rnnenum **)realloc(__ptr,(long)iVar6 << 3);
            db->enums = __ptr;
            uVar24 = db->enumsnum;
          }
          db->enumsnum = uVar24 + 1;
          __ptr[(int)uVar24] = prVar8;
          goto LAB_0016f13b;
        }
        prVar8 = db->enums[uVar22];
        iVar5 = strcmp(prVar8->name,pcVar17);
        uVar22 = uVar22 + 1;
      } while (iVar5 != 0);
      iVar5 = strdiff((prVar8->varinfo).prefixstr,local_60);
      if ((((iVar5 != 0) || (iVar5 = strdiff((prVar8->varinfo).varsetstr,local_50), iVar5 != 0)) ||
          (iVar5 = strdiff((prVar8->varinfo).variantsstr,local_48), iVar5 != 0)) ||
         ((prVar8->isinline != iVar4 || (prVar8->bare != iVar6)))) {
        fprintf(_stderr,"%s:%d: merge fail for enum %s\n",file,(ulong)node->line,node->name);
        db->estatus = 1;
      }
LAB_0016f13b:
      pp_Var25 = &node->children;
      while (prVar3 = (rnndb *)*pp_Var25, prVar3 != (rnndb *)0x0) {
        if (*(int *)&(prVar3->copyright).license == 1) {
          iVar4 = strcmp((char *)(prVar3->copyright).authors,"value");
          if (iVar4 == 0) {
            prVar13 = parsevalue(db,file,(xmlNode *)prVar3);
            if (prVar13 != (rnnvalue *)0x0) {
              iVar4 = prVar8->valsnum;
              iVar6 = prVar8->valsmax;
              __ptr_03 = prVar8->vals;
              if (iVar6 <= iVar4) {
                iVar4 = iVar6 * 2;
                if (iVar6 == 0) {
                  iVar4 = 0x10;
                }
                prVar8->valsmax = iVar4;
                __ptr_03 = (rnnvalue **)realloc(__ptr_03,(long)iVar4 << 3);
                prVar8->vals = __ptr_03;
                iVar4 = prVar8->valsnum;
              }
              prVar8->valsnum = iVar4 + 1;
              __ptr_03[iVar4] = prVar13;
            }
          }
          else {
            pcVar17 = file;
            iVar4 = trytop(db,file,(xmlNode *)prVar3);
            if ((iVar4 == 0) && (iVar4 = trydoc(prVar3,pcVar17,node_02), iVar4 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in enum: <%s>\n",file,
                      (ulong)*(ushort *)&prVar3->files,(prVar3->copyright).authors);
              db->estatus = 1;
            }
          }
        }
        pp_Var25 = (_xmlNode **)&prVar3->bitsets;
      }
      return 1;
    }
    uVar20 = (ulong)node->line;
    pcVar17 = "%s:%d: nameless enum\n";
LAB_0016f98b:
    fprintf(_stderr,pcVar17,file,uVar20);
    db->estatus = 1;
    return 1;
  }
  iVar4 = strcmp((char *)pxVar1,"bitset");
  if (iVar4 == 0) {
    pcVar17 = (char *)0x0;
    iVar4 = 0;
    iVar6 = 0;
    local_60 = (char *)0x0;
    local_50 = (char *)0x0;
    local_48 = (char *)0x0;
    pp_Var21 = &node->properties;
    while (pxVar2 = *pp_Var21, pxVar2 != (xmlAttr *)0x0) {
      pxVar1 = pxVar2->name;
      iVar5 = strcmp((char *)pxVar1,"name");
      if (iVar5 == 0) {
        pcVar17 = getattrib(db,file,(uint)node->line,pxVar2);
      }
      else {
        iVar5 = strcmp((char *)pxVar1,"bare");
        if (iVar5 == 0) {
          iVar6 = getboolattrib(db,file,(uint)node->line,pxVar2);
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"inline");
          if (iVar5 == 0) {
            iVar4 = getboolattrib(db,file,(uint)node->line,pxVar2);
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"prefix");
            if (iVar5 == 0) {
              pcVar10 = getattrib(db,file,(uint)node->line,pxVar2);
              local_60 = strdup(pcVar10);
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"varset");
              if (iVar5 == 0) {
                pcVar10 = getattrib(db,file,(uint)node->line,pxVar2);
                local_50 = strdup(pcVar10);
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"variants");
                if (iVar5 == 0) {
                  pcVar10 = getattrib(db,file,(uint)node->line,pxVar2);
                  local_48 = strdup(pcVar10);
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for bitset\n",file,
                          (ulong)node->line,pxVar1);
                  db->estatus = 1;
                }
              }
            }
          }
        }
      }
      pp_Var21 = &pxVar2->next;
    }
    if (pcVar17 != (char *)0x0) {
      uVar24 = db->bitsetsnum;
      uVar22 = 0;
      uVar20 = 0;
      if (0 < (int)uVar24) {
        uVar20 = (ulong)uVar24;
      }
      do {
        if (uVar20 == uVar22) {
          prVar9 = (rnnbitset *)calloc(0x70,1);
          pcVar17 = strdup(pcVar17);
          prVar9->name = pcVar17;
          prVar9->isinline = iVar4;
          prVar9->bare = iVar6;
          (prVar9->varinfo).prefixstr = local_60;
          (prVar9->varinfo).varsetstr = local_50;
          (prVar9->varinfo).variantsstr = local_48;
          prVar9->file = file;
          iVar4 = db->bitsetsmax;
          __ptr_00 = db->bitsets;
          if (iVar4 <= (int)uVar24) {
            iVar6 = iVar4 * 2;
            if (iVar4 == 0) {
              iVar6 = 0x10;
            }
            db->bitsetsmax = iVar6;
            __ptr_00 = (rnnbitset **)realloc(__ptr_00,(long)iVar6 << 3);
            db->bitsets = __ptr_00;
            uVar24 = db->bitsetsnum;
          }
          db->bitsetsnum = uVar24 + 1;
          __ptr_00[(int)uVar24] = prVar9;
          goto LAB_0016f3ab;
        }
        prVar9 = db->bitsets[uVar22];
        iVar5 = strcmp(prVar9->name,pcVar17);
        uVar22 = uVar22 + 1;
      } while (iVar5 != 0);
      iVar5 = strdiff((prVar9->varinfo).prefixstr,local_60);
      if ((((iVar5 != 0) || (iVar5 = strdiff((prVar9->varinfo).varsetstr,local_50), iVar5 != 0)) ||
          (iVar5 = strdiff((prVar9->varinfo).variantsstr,local_48), iVar5 != 0)) ||
         ((prVar9->isinline != iVar4 || (prVar9->bare != iVar6)))) {
        fprintf(_stderr,"%s:%d: merge fail for bitset %s\n",file,(ulong)node->line,node->name);
        db->estatus = 1;
      }
LAB_0016f3ab:
      pp_Var25 = &node->children;
      while (prVar3 = (rnndb *)*pp_Var25, prVar3 != (rnndb *)0x0) {
        if (*(int *)&(prVar3->copyright).license == 1) {
          iVar4 = strcmp((char *)(prVar3->copyright).authors,"bitfield");
          if (iVar4 == 0) {
            prVar15 = parsebitfield(db,file,(xmlNode *)prVar3);
            if (prVar15 != (rnnbitfield *)0x0) {
              iVar4 = prVar9->bitfieldsnum;
              iVar6 = prVar9->bitfieldsmax;
              __ptr_05 = prVar9->bitfields;
              if (iVar6 <= iVar4) {
                iVar4 = iVar6 * 2;
                if (iVar6 == 0) {
                  iVar4 = 0x10;
                }
                prVar9->bitfieldsmax = iVar4;
                __ptr_05 = (rnnbitfield **)realloc(__ptr_05,(long)iVar4 << 3);
                prVar9->bitfields = __ptr_05;
                iVar4 = prVar9->bitfieldsnum;
              }
              prVar9->bitfieldsnum = iVar4 + 1;
              __ptr_05[iVar4] = prVar15;
            }
          }
          else {
            pcVar17 = file;
            iVar4 = trytop(db,file,(xmlNode *)prVar3);
            if ((iVar4 == 0) && (iVar4 = trydoc(prVar3,pcVar17,node_03), iVar4 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in bitset: <%s>\n",file,
                      (ulong)*(ushort *)&prVar3->files,(prVar3->copyright).authors);
              db->estatus = 1;
            }
          }
        }
        pp_Var25 = (_xmlNode **)&prVar3->bitsets;
      }
      return 1;
    }
    uVar20 = (ulong)node->line;
    pcVar17 = "%s:%d: nameless bitset\n";
    goto LAB_0016f98b;
  }
  iVar4 = strcmp((char *)pxVar1,"group");
  if (iVar4 == 0) {
    pcVar17 = (char *)0x0;
    pp_Var21 = &node->properties;
    while (pxVar2 = *pp_Var21, pxVar2 != (xmlAttr *)0x0) {
      pxVar1 = pxVar2->name;
      iVar4 = strcmp((char *)pxVar1,"name");
      if (iVar4 == 0) {
        pcVar17 = getattrib(db,file,(uint)node->line,pxVar2);
      }
      else {
        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for group\n",file,(ulong)node->line,pxVar1);
        db->estatus = 1;
      }
      pp_Var21 = &pxVar2->next;
    }
    if (pcVar17 != (char *)0x0) {
      uVar24 = db->groupsnum;
      uVar22 = 0;
      uVar20 = 0;
      if (0 < (int)uVar24) {
        uVar20 = (ulong)uVar24;
      }
      do {
        if (uVar20 == uVar22) {
          prVar11 = (rnngroup *)calloc(0x18,1);
          pcVar17 = strdup(pcVar17);
          prVar11->name = pcVar17;
          iVar4 = db->groupsmax;
          __ptr_01 = db->groups;
          if (iVar4 <= (int)uVar24) {
            iVar6 = iVar4 * 2;
            if (iVar4 == 0) {
              iVar6 = 0x10;
            }
            db->groupsmax = iVar6;
            __ptr_01 = (rnngroup **)realloc(__ptr_01,(long)iVar6 << 3);
            db->groups = __ptr_01;
            uVar24 = db->groupsnum;
          }
          db->groupsnum = uVar24 + 1;
          __ptr_01[(int)uVar24] = prVar11;
          break;
        }
        prVar11 = db->groups[uVar22];
        iVar4 = strcmp(prVar11->name,pcVar17);
        uVar22 = uVar22 + 1;
      } while (iVar4 != 0);
      pp_Var25 = &node->children;
      while (prVar3 = (rnndb *)*pp_Var25, prVar3 != (rnndb *)0x0) {
        if (*(int *)&(prVar3->copyright).license == 1) {
          prVar18 = trydelem(db,file,(xmlNode *)prVar3);
          if (prVar18 == (rnndelem *)0x0) {
            pcVar17 = file;
            iVar4 = trytop(db,file,(xmlNode *)prVar3);
            if ((iVar4 == 0) && (iVar4 = trydoc(prVar3,pcVar17,node_00), iVar4 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in group: <%s>\n",file,
                      (ulong)*(ushort *)&prVar3->files,(prVar3->copyright).authors);
              db->estatus = 1;
            }
          }
          else {
            iVar4 = prVar11->subelemsnum;
            iVar6 = prVar11->subelemsmax;
            pprVar19 = prVar11->subelems;
            if (iVar6 <= iVar4) {
              iVar4 = iVar6 * 2;
              if (iVar6 == 0) {
                iVar4 = 0x10;
              }
              prVar11->subelemsmax = iVar4;
              pprVar19 = (rnndelem **)realloc(pprVar19,(long)iVar4 << 3);
              prVar11->subelems = pprVar19;
              iVar4 = prVar11->subelemsnum;
            }
            prVar11->subelemsnum = iVar4 + 1;
            pprVar19[iVar4] = prVar18;
          }
        }
        pp_Var25 = (_xmlNode **)&prVar3->bitsets;
      }
      return 1;
    }
    uVar20 = (ulong)node->line;
    pcVar17 = "%s:%d: nameless group\n";
    goto LAB_0016f98b;
  }
  iVar4 = strcmp((char *)pxVar1,"domain");
  if (iVar4 != 0) {
    iVar4 = strcmp((char *)pxVar1,"spectype");
    if (iVar4 == 0) {
      prVar12 = (rnnspectype *)calloc(0x88,1);
      prVar12->file = file;
      pp_Var21 = &node->properties;
      while (pxVar2 = *pp_Var21, pxVar2 != (xmlAttr *)0x0) {
        iVar4 = strcmp((char *)pxVar2->name,"name");
        if (iVar4 == 0) {
          pcVar17 = getattrib(db,file,(uint)node->line,pxVar2);
          pcVar17 = strdup(pcVar17);
          prVar12->name = pcVar17;
        }
        else {
          iVar4 = trytypeattr(db,file,node,pxVar2,&prVar12->typeinfo);
          if (iVar4 == 0) {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for spectype\n",file,(ulong)node->line,
                    pxVar2->name);
            db->estatus = 1;
          }
        }
        pp_Var21 = &pxVar2->next;
      }
      pcVar17 = prVar12->name;
      if (pcVar17 == (char *)0x0) {
        uVar20 = (ulong)node->line;
        pcVar17 = "%s:%d: nameless spectype\n";
        goto LAB_0016f98b;
      }
      uVar24 = db->spectypesnum;
      uVar22 = 0;
      uVar20 = 0;
      if (0 < (int)uVar24) {
        uVar20 = (ulong)uVar24;
      }
      do {
        if (uVar20 == uVar22) {
          iVar4 = db->spectypesmax;
          __ptr_02 = db->spectypes;
          if (iVar4 <= (int)uVar24) {
            iVar6 = iVar4 * 2;
            if (iVar4 == 0) {
              iVar6 = 0x10;
            }
            db->spectypesmax = iVar6;
            __ptr_02 = (rnnspectype **)realloc(__ptr_02,(long)iVar6 << 3);
            db->spectypes = __ptr_02;
            uVar24 = db->spectypesnum;
          }
          db->spectypesnum = uVar24 + 1;
          __ptr_02[(int)uVar24] = prVar12;
          pp_Var25 = &node->children;
          while (prVar3 = (rnndb *)*pp_Var25, prVar3 != (rnndb *)0x0) {
            if ((((*(int *)&(prVar3->copyright).license == 1) &&
                 (iVar4 = trytypetag(db,file,(xmlNode *)prVar3,&prVar12->typeinfo), iVar4 == 0)) &&
                (pcVar17 = file, iVar4 = trytop(db,file,(xmlNode *)prVar3), iVar4 == 0)) &&
               (iVar4 = trydoc(prVar3,pcVar17,node_01), iVar4 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in spectype: <%s>\n",file,
                      (ulong)*(ushort *)&prVar3->files,(prVar3->copyright).authors);
              db->estatus = 1;
            }
            pp_Var25 = (_xmlNode **)&prVar3->bitsets;
          }
          return 1;
        }
        iVar4 = strcmp(db->spectypes[uVar22]->name,pcVar17);
        uVar22 = uVar22 + 1;
      } while (iVar4 != 0);
      fprintf(_stderr,"%s:%d: duplicated spectype name %s\n",file,(ulong)node->line,pcVar17);
    }
    else {
      iVar4 = strcmp((char *)pxVar1,"import");
      if (iVar4 != 0) {
        iVar4 = strcmp((char *)pxVar1,"copyright");
        if (iVar4 != 0) {
          return 0;
        }
        pp_Var21 = &node->properties;
        while (pxVar2 = *pp_Var21, pxVar2 != (xmlAttr *)0x0) {
          pxVar1 = pxVar2->name;
          iVar4 = strcmp((char *)pxVar1,"year");
          if (iVar4 == 0) {
            uVar7 = getnumattrib(db,file,(uint)node->line,pxVar2);
            if ((uint)uVar7 <= (db->copyright).firstyear - 1) {
              (db->copyright).firstyear = (uint)uVar7;
            }
          }
          else {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for copyright\n",file,(ulong)node->line,
                    pxVar1);
            db->estatus = 1;
          }
          pp_Var21 = &pxVar2->next;
        }
        pp_Var25 = &node->children;
        do {
          attr = *pp_Var25;
          if (attr == (xmlNode *)0x0) {
            return 1;
          }
          if (attr->type == XML_ELEMENT_NODE) {
            pxVar1 = attr->name;
            iVar4 = strcmp((char *)pxVar1,"license");
            if (iVar4 == 0) {
              pcVar17 = (db->copyright).license;
              if (pcVar17 == (char *)0x0) {
                pcVar17 = getcontent(attr);
                (db->copyright).license = pcVar17;
              }
              else {
                iVar4 = strcmp(pcVar17,(char *)node->content);
                if (iVar4 != 0) {
                  fwrite("fatal error: multiple different licenses specified!\n",0x34,1,_stderr);
                  abort();
                }
              }
            }
            else {
              iVar4 = strcmp((char *)pxVar1,"author");
              if (iVar4 == 0) {
                prVar16 = (rnnauthor *)calloc(0x30,1);
                p_Var23 = attr->children;
                attr_00 = attr->properties;
                pcVar17 = getcontent(attr);
                prVar16->contributions = pcVar17;
                for (; attr_00 != (xmlAttr *)0x0; attr_00 = attr_00->next) {
                  pxVar1 = attr_00->name;
                  iVar4 = strcmp((char *)pxVar1,"name");
                  if (iVar4 == 0) {
                    pcVar17 = getattrib(db,file,(uint)attr->line,attr_00);
                    pcVar17 = strdup(pcVar17);
                    prVar16->name = pcVar17;
                  }
                  else {
                    iVar4 = strcmp((char *)pxVar1,"email");
                    if (iVar4 == 0) {
                      pcVar17 = getattrib(db,file,(uint)attr->line,attr_00);
                      pcVar17 = strdup(pcVar17);
                      prVar16->email = pcVar17;
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for author\n",file,
                              (ulong)attr->line,pxVar1);
                      db->estatus = 1;
                    }
                  }
                }
                for (; p_Var23 != (_xmlNode *)0x0; p_Var23 = p_Var23->next) {
                  if (p_Var23->type == XML_ELEMENT_NODE) {
                    pxVar1 = p_Var23->name;
                    iVar4 = strcmp((char *)pxVar1,"nick");
                    if (iVar4 == 0) {
                      pcVar17 = (char *)0x0;
                      pp_Var21 = &p_Var23->properties;
                      while (pxVar2 = *pp_Var21, pxVar2 != (xmlAttr *)0x0) {
                        pxVar1 = pxVar2->name;
                        iVar4 = strcmp((char *)pxVar1,"name");
                        if (iVar4 == 0) {
                          pcVar17 = getattrib(db,file,(uint)p_Var23->line,pxVar2);
                          pcVar17 = strdup(pcVar17);
                        }
                        else {
                          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for nick\n",file,
                                  (ulong)p_Var23->line,pxVar1);
                          db->estatus = 1;
                        }
                        pp_Var21 = &pxVar2->next;
                      }
                      if (pcVar17 != (char *)0x0) {
                        iVar4 = prVar16->nicknamesnum;
                        iVar6 = prVar16->nicknamesmax;
                        __ptr_06 = prVar16->nicknames;
                        if (iVar6 <= iVar4) {
                          iVar4 = iVar6 * 2;
                          if (iVar6 == 0) {
                            iVar4 = 0x10;
                          }
                          prVar16->nicknamesmax = iVar4;
                          __ptr_06 = (char **)realloc(__ptr_06,(long)iVar4 << 3);
                          prVar16->nicknames = __ptr_06;
                          iVar4 = prVar16->nicknamesnum;
                        }
                        prVar16->nicknamesnum = iVar4 + 1;
                        __ptr_06[iVar4] = pcVar17;
                        goto LAB_0016f6dd;
                      }
                      fprintf(_stderr,"%s:%d: missing \"name\" attribute for nick\n",file,
                              (ulong)p_Var23->line);
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong tag in author: <%s>\n",file,(ulong)p_Var23->line
                              ,pxVar1);
                    }
                    db->estatus = 1;
                  }
LAB_0016f6dd:
                }
                iVar4 = (db->copyright).authorsnum;
                iVar6 = (db->copyright).authorsmax;
                __ptr_07 = (db->copyright).authors;
                if (iVar6 <= iVar4) {
                  iVar4 = iVar6 * 2;
                  if (iVar6 == 0) {
                    iVar4 = 0x10;
                  }
                  (db->copyright).authorsmax = iVar4;
                  __ptr_07 = (rnnauthor **)realloc(__ptr_07,(long)iVar4 << 3);
                  (db->copyright).authors = __ptr_07;
                  iVar4 = (db->copyright).authorsnum;
                }
                (db->copyright).authorsnum = iVar4 + 1;
                __ptr_07[iVar4] = prVar16;
              }
              else {
                fprintf(_stderr,"%s:%d: wrong tag in copyright: <%s>\n",file,(ulong)attr->line,
                        pxVar1);
                db->estatus = 1;
              }
            }
          }
          pp_Var25 = &attr->next;
        } while( true );
      }
      pcVar17 = (char *)0x0;
      pp_Var21 = &node->properties;
      while (pxVar2 = *pp_Var21, pxVar2 != (xmlAttr *)0x0) {
        pxVar1 = pxVar2->name;
        iVar4 = strcmp((char *)pxVar1,"file");
        if (iVar4 == 0) {
          pcVar17 = getattrib(db,file,(uint)node->line,pxVar2);
        }
        else {
          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for import\n",file,(ulong)node->line,pxVar1
                 );
          db->estatus = 1;
        }
        pp_Var21 = &pxVar2->next;
      }
      if (pcVar17 != (char *)0x0) {
        rnn_parsefile(db,pcVar17);
        return 1;
      }
      fprintf(_stderr,"%s:%d: missing \"file\" attribute for import\n",file,(ulong)node->line);
    }
    db->estatus = 1;
    return 1;
  }
  local_60 = (char *)0x8;
  pcVar17 = (char *)0x0;
  uVar7 = 0;
  iVar4 = 0;
  local_48 = (char *)0x0;
  local_40 = (char *)0x0;
  local_50 = (char *)0x0;
  pp_Var21 = &node->properties;
  while (pxVar2 = *pp_Var21, pxVar2 != (xmlAttr *)0x0) {
    pxVar1 = pxVar2->name;
    iVar6 = strcmp((char *)pxVar1,"name");
    if (iVar6 == 0) {
      pcVar17 = getattrib(db,file,(uint)node->line,pxVar2);
    }
    else {
      iVar6 = strcmp((char *)pxVar1,"bare");
      if (iVar6 == 0) {
        iVar4 = getboolattrib(db,file,(uint)node->line,pxVar2);
      }
      else {
        iVar6 = strcmp((char *)pxVar1,"size");
        if (iVar6 == 0) {
          uVar7 = getnumattrib(db,file,(uint)node->line,pxVar2);
        }
        else {
          iVar6 = strcmp((char *)pxVar1,"width");
          if (iVar6 == 0) {
            local_60 = (char *)getnumattrib(db,file,(uint)node->line,pxVar2);
          }
          else {
            iVar6 = strcmp((char *)pxVar1,"prefix");
            if (iVar6 == 0) {
              pcVar10 = getattrib(db,file,(uint)node->line,pxVar2);
              local_48 = strdup(pcVar10);
            }
            else {
              iVar6 = strcmp((char *)pxVar1,"varset");
              if (iVar6 == 0) {
                pcVar10 = getattrib(db,file,(uint)node->line,pxVar2);
                local_40 = strdup(pcVar10);
              }
              else {
                iVar6 = strcmp((char *)pxVar1,"variants");
                if (iVar6 == 0) {
                  pcVar10 = getattrib(db,file,(uint)node->line,pxVar2);
                  local_50 = strdup(pcVar10);
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for domain\n",file,
                          (ulong)node->line,pxVar1);
                  db->estatus = 1;
                }
              }
            }
          }
        }
      }
    }
    pp_Var21 = &pxVar2->next;
  }
  if (pcVar17 == (char *)0x0) {
    uVar20 = (ulong)node->line;
    pcVar17 = "%s:%d: nameless domain\n";
    goto LAB_0016f98b;
  }
  uVar24 = db->domainsnum;
  uVar22 = 0;
  uVar20 = 0;
  if (0 < (int)uVar24) {
    uVar20 = (ulong)uVar24;
  }
  do {
    if (uVar20 == uVar22) {
      prVar14 = (rnndomain *)calloc(0x80,1);
      pcVar17 = strdup(pcVar17);
      prVar14->name = pcVar17;
      prVar14->bare = iVar4;
      prVar14->width = (int)local_60;
      prVar14->size = uVar7;
      (prVar14->varinfo).prefixstr = local_48;
      (prVar14->varinfo).varsetstr = local_40;
      (prVar14->varinfo).variantsstr = local_50;
      prVar14->file = file;
      iVar4 = db->domainsmax;
      __ptr_04 = db->domains;
      if (iVar4 <= (int)uVar24) {
        iVar6 = iVar4 * 2;
        if (iVar4 == 0) {
          iVar6 = 0x10;
        }
        db->domainsmax = iVar6;
        __ptr_04 = (rnndomain **)realloc(__ptr_04,(long)iVar6 << 3);
        db->domains = __ptr_04;
        uVar24 = db->domainsnum;
      }
      db->domainsnum = uVar24 + 1;
      __ptr_04[(int)uVar24] = prVar14;
      goto LAB_0016f865;
    }
    prVar14 = db->domains[uVar22];
    iVar6 = strcmp(prVar14->name,pcVar17);
    uVar22 = uVar22 + 1;
  } while (iVar6 != 0);
  iVar6 = strdiff((prVar14->varinfo).prefixstr,local_48);
  if (((iVar6 == 0) && (iVar6 = strdiff((prVar14->varinfo).varsetstr,local_40), iVar6 == 0)) &&
     ((iVar6 = strdiff((prVar14->varinfo).variantsstr,local_50), iVar6 == 0 &&
      ((prVar14->width == (int)local_60 && (prVar14->bare == iVar4)))))) {
    if (uVar7 == 0) goto LAB_0016f865;
    if ((prVar14->size == 0) || (uVar7 == prVar14->size)) {
      prVar14->size = uVar7;
      goto LAB_0016f865;
    }
  }
  fprintf(_stderr,"%s:%d: merge fail for domain %s\n",file,(ulong)node->line,node->name);
  db->estatus = 1;
LAB_0016f865:
  pp_Var25 = &node->children;
  while (prVar3 = (rnndb *)*pp_Var25, prVar3 != (rnndb *)0x0) {
    if (*(int *)&(prVar3->copyright).license == 1) {
      prVar18 = trydelem(db,file,(xmlNode *)prVar3);
      if (prVar18 == (rnndelem *)0x0) {
        pcVar17 = file;
        iVar4 = trytop(db,file,(xmlNode *)prVar3);
        if ((iVar4 == 0) && (iVar4 = trydoc(prVar3,pcVar17,node_04), iVar4 == 0)) {
          fprintf(_stderr,"%s:%d: wrong tag in domain: <%s>\n",file,(ulong)*(ushort *)&prVar3->files
                  ,(prVar3->copyright).authors);
          db->estatus = 1;
        }
      }
      else {
        iVar4 = prVar14->subelemsnum;
        iVar6 = prVar14->subelemsmax;
        pprVar19 = prVar14->subelems;
        if (iVar6 <= iVar4) {
          iVar4 = iVar6 * 2;
          if (iVar6 == 0) {
            iVar4 = 0x10;
          }
          prVar14->subelemsmax = iVar4;
          pprVar19 = (rnndelem **)realloc(pprVar19,(long)iVar4 << 3);
          prVar14->subelems = pprVar19;
          iVar4 = prVar14->subelemsnum;
        }
        prVar14->subelemsnum = iVar4 + 1;
        pprVar19[iVar4] = prVar18;
      }
    }
    pp_Var25 = (_xmlNode **)&prVar3->bitsets;
  }
  return 1;
}

Assistant:

static int trytop (struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "enum")) {
		parseenum(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "bitset")) {
		parsebitset(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "group")) {
		parsegroup(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "domain")) {
		parsedomain(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "spectype")) {
		parsespectype(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "import")) {
		xmlAttr *attr = node->properties;
		char *subfile = 0;
		while (attr) {
			if (!strcmp(attr->name, "file")) {
				subfile = getattrib(db, file, node->line, attr);
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for import\n", file, node->line, attr->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!subfile) {
			fprintf (stderr, "%s:%d: missing \"file\" attribute for import\n", file, node->line);
			db->estatus = 1;
		} else {
			rnn_parsefile(db, subfile);
		}
		return 1;
	} else if (!strcmp(node->name, "copyright")) {
		parsecopyright(db, file, node);
		return 1;
	}
	return 0;
}